

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_cpy_impl(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,_Bool inplace)

{
  int iVar1;
  int iVar2;
  ggml_tensor *pgVar3;
  byte in_CL;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  _Bool is_node;
  ggml_tensor *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  
  iVar1 = ggml_nelements(in_RSI);
  iVar2 = ggml_nelements(in_RDX);
  if (iVar1 != iVar2) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xe93,
            "ggml_nelements(a) == ggml_nelements(b)");
    abort();
  }
  if (((in_CL & 1) == 0) &&
     ((in_RSI->grad != (ggml_tensor *)0x0 || (in_RDX->grad != (ggml_tensor *)0x0)))) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xe98,
            "false");
    abort();
  }
  pgVar3 = ggml_view_tensor((ggml_context *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffc8);
  pgVar3->op = GGML_OP_CPY;
  pgVar3->grad = (ggml_tensor *)0x0;
  pgVar3->src0 = in_RSI;
  pgVar3->src1 = in_RDX;
  return pgVar3;
}

Assistant:

struct ggml_tensor * ggml_cpy_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        bool inplace) {
    GGML_ASSERT(ggml_nelements(a) == ggml_nelements(b));

    bool is_node = false;

    if (!inplace && (a->grad || b->grad)) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    // make a view of the destination
    struct ggml_tensor * result = ggml_view_tensor(ctx, b);

    result->op   = GGML_OP_CPY;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b;

    return result;
}